

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O0

void do_strip(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  int chance;
  char arg2 [4608];
  char arg1 [4608];
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffdbc8;
  int in_stack_ffffffffffffdbcc;
  int in_stack_ffffffffffffdbd0;
  undefined4 in_stack_ffffffffffffdbd4;
  undefined4 in_stack_ffffffffffffdbd8;
  int in_stack_ffffffffffffdbdc;
  CHAR_DATA *in_stack_ffffffffffffdbe0;
  CHAR_DATA *in_stack_ffffffffffffdbe8;
  OBJ_DATA *in_stack_ffffffffffffdbf0;
  int in_stack_ffffffffffffdbfc;
  undefined7 in_stack_ffffffffffffdc00;
  undefined1 in_stack_ffffffffffffdc07;
  OBJ_DATA *in_stack_ffffffffffffdc08;
  CHAR_DATA *in_stack_ffffffffffffdc10;
  int in_stack_ffffffffffffdca4;
  undefined1 in_stack_ffffffffffffdcab;
  int in_stack_ffffffffffffdcac;
  CHAR_DATA *in_stack_ffffffffffffdcb0;
  int in_stack_ffffffffffffdccc;
  CHAR_DATA *in_stack_ffffffffffffdcd0;
  char *in_stack_ffffffffffffedd0;
  char in_stack_ffffffffffffedd8;
  undefined7 in_stack_ffffffffffffedd9;
  CHAR_DATA *in_stack_ffffffffffffede8;
  CHAR_DATA *in_stack_ffffffffffffedf0;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  OBJ_DATA *local_20;
  
  if (*in_RSI == '\0') {
    send_to_char((char *)in_stack_ffffffffffffdbe0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
  }
  else {
    one_argument((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                 (char *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8));
    one_argument((char *)CONCAT44(in_stack_ffffffffffffdbd4,in_stack_ffffffffffffdbd0),
                 (char *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8));
    iVar2 = get_skill(in_stack_ffffffffffffdcd0,in_stack_ffffffffffffdccc);
    if (iVar2 == 0) {
      send_to_char((char *)in_stack_ffffffffffffdbe0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
    }
    else if ((char)in_stack_ffffffffffffdbd8 == '\0') {
      send_to_char((char *)in_stack_ffffffffffffdbe0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
    }
    else {
      ch_00 = get_char_room((CHAR_DATA *)
                            CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8),
                            in_stack_ffffffffffffedd0);
      if (ch_00 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffdbe0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
      }
      else if (ch_00 == in_RDI) {
        send_to_char((char *)in_stack_ffffffffffffdbe0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
      }
      else if (in_stack_ffffffffffffedd8 == '\0') {
        send_to_char((char *)in_stack_ffffffffffffdbe0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
      }
      else {
        local_20 = ch_00->carrying;
        while ((local_20 != (OBJ_DATA *)0x0 &&
               ((local_20->wear_loc == -1 ||
                (bVar1 = is_name(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0), !bVar1))))) {
          local_20 = local_20->next_content;
        }
        if (local_20 == (OBJ_DATA *)0x0) {
          act((char *)in_stack_ffffffffffffdbe0,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),
              (void *)CONCAT44(iVar2,in_stack_ffffffffffffdbd0),
              (void *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8),0);
        }
        else if (((((local_20->wear_loc == 5) || (local_20->wear_loc == 10)) ||
                  (local_20->wear_loc == 7)) ||
                 ((local_20->wear_loc == 0xd || (local_20->wear_loc == 0xc)))) ||
                (local_20->wear_loc == 0x13)) {
          act((char *)in_stack_ffffffffffffdbe0,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),
              (void *)CONCAT44(iVar2,in_stack_ffffffffffffdbd0),
              (void *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8),0);
        }
        else {
          iVar2 = iVar2 / 2;
          iVar3 = get_curr_stat((CHAR_DATA *)
                                CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
                                in_stack_ffffffffffffdbfc);
          iVar2 = (iVar3 + -0x14) * 6 + iVar2;
          bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8))
          ;
          if (bVar1) {
            iVar3 = ((int)ch_00->level - (int)in_RDI->level) * -5;
          }
          else {
            iVar3 = ((int)ch_00->level - (int)in_RDI->level) * -2;
          }
          iVar2 = iVar2 + iVar3;
          bVar1 = can_see(in_stack_ffffffffffffdbe8,in_stack_ffffffffffffdbe0);
          if (bVar1) {
            iVar2 = iVar2 + -0x19;
          }
          else {
            iVar2 = iVar2 + 5;
          }
          bVar1 = is_affected_by((CHAR_DATA *)
                                 CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),iVar2
                                );
          if (!bVar1) {
            iVar2 = iVar2 + -10;
          }
          bVar1 = is_awake(ch_00);
          if (bVar1) {
            iVar3 = get_curr_stat((CHAR_DATA *)
                                  CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
                                  in_stack_ffffffffffffdbfc);
            iVar2 = iVar2 + (iVar3 + -0xf) * -2;
          }
          else {
            iVar2 = iVar2 + 0x19;
          }
          bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8))
          ;
          if ((bVar1) && (ch_00->pIndexData->pShop != (SHOP_DATA *)0x0)) {
            iVar2 = 0;
          }
          bVar1 = is_awake(ch_00);
          if (((bVar1) && ((local_20->wear_loc == 1 || (local_20->wear_loc == 2)))) ||
             (bVar1 = is_awake(ch_00), !bVar1)) {
            iVar3 = number_percent();
            if (iVar3 < iVar2 + -0x1e) {
              unequip_char(in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc08,
                           (bool)in_stack_ffffffffffffdc07);
              obj_from_char(in_stack_ffffffffffffdbf0);
              obj_to_char((OBJ_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffdbd0),
                          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8)
                         );
              act((char *)in_stack_ffffffffffffdbe0,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),
                  (void *)CONCAT44(iVar2,in_stack_ffffffffffffdbd0),
                  (void *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8),0);
              check_improve(in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcac,
                            (bool)in_stack_ffffffffffffdcab,in_stack_ffffffffffffdca4);
              iVar3 = number_range(in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbcc);
              if (3 < iVar3) {
                act((char *)in_stack_ffffffffffffdbe0,
                    (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),
                    (void *)CONCAT44(iVar2,in_stack_ffffffffffffdbd0),
                    (void *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8),0);
                act((char *)in_stack_ffffffffffffdbe0,
                    (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),
                    (void *)CONCAT44(iVar2,in_stack_ffffffffffffdbd0),
                    (void *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8),0);
                thief_yell(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
              }
            }
            else {
              act((char *)in_stack_ffffffffffffdbe0,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),
                  (void *)CONCAT44(iVar2,in_stack_ffffffffffffdbd0),
                  (void *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8),0);
              thief_yell(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
              check_improve(in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcac,
                            (bool)in_stack_ffffffffffffdcab,in_stack_ffffffffffffdca4);
            }
          }
          else {
            act((char *)in_stack_ffffffffffffdbe0,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8),
                (void *)CONCAT44(iVar2,in_stack_ffffffffffffdbd0),
                (void *)CONCAT44(in_stack_ffffffffffffdbcc,in_stack_ffffffffffffdbc8),0);
            thief_yell(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
            check_improve(in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcac,
                          (bool)in_stack_ffffffffffffdcab,in_stack_ffffffffffffdca4);
          }
          WAIT_STATE(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbdc);
        }
      }
    }
  }
  return;
}

Assistant:

void do_strip(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	char arg1[MSL], arg2[MSL];
	int chance;

	if (argument[0] == '\0')
	{
		send_to_char("Strip what from whom?\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	chance = get_skill(ch, gsn_strip);

	if (chance == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (arg2[0] == '\0')
	{
		send_to_char("Strip whom?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg2);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("That would be silly.\n\r", ch);
		return;
	}

	if (arg1[0] == '\0')
	{
		send_to_char("Strip what?\n\r", ch);
		return;
	}

	for (obj = victim->carrying; obj; obj = obj->next_content)
	{
		if (obj->wear_loc != WEAR_NONE && is_name(arg1, obj->name))
			break;
	}

	if (!obj)
	{
		act("$N is not wearing $t.", ch, arg1, victim, TO_CHAR);
		return;
	}

	if (obj->wear_loc == WEAR_BODY
		|| obj->wear_loc == WEAR_ARMS
		|| obj->wear_loc == WEAR_LEGS
		|| obj->wear_loc == WEAR_WAIST
		|| obj->wear_loc == WEAR_ABOUT
		|| obj->wear_loc == WEAR_BRAND)
	{
		act("You couldn't possibly strip that!", ch, obj, victim, TO_CHAR);
		return;
	}

	chance /= 2;
	chance += 6 * (get_curr_stat(ch, STAT_DEX) - 20);

	if (is_npc(victim))
		chance -= 5 * (victim->level - ch->level);
	else
		chance -= 2 * (victim->level - ch->level);

	if (can_see(victim, ch))
		chance -= 25;
	else
		chance += 5;

	if (!is_affected_by(ch, AFF_SNEAK))
		chance -= 10;

	if (!is_awake(victim))
		chance += 25;
	else
		chance -= 2 * (get_curr_stat(victim, STAT_DEX) - 15);

	if (is_npc(victim) && victim->pIndexData->pShop)
		chance = 0;

	if ((is_awake(victim)
			&& (obj->wear_loc == WEAR_FINGER_L || obj->wear_loc == WEAR_FINGER_R))
		|| (!is_awake(victim)))
	{
		if (number_percent() < (chance - 30))
		{
			unequip_char(victim, obj, true);

			obj_from_char(obj);
			obj_to_char(obj, ch);

			act("You silently strip $p from $N.", ch, obj, victim, TO_CHAR);

			check_improve(ch, gsn_strip, true, 1);

			if (number_range(1, 5) > 3)
			{
				act("You botch your strip, still managing to get $p, but $N wakes up!", ch, obj, victim, TO_CHAR);
				act("$n botches $s strip, still managing to get $p from you!", ch, obj, victim, TO_VICT);
				thief_yell(ch, victim);
			}
		}
		else
		{
			act("Oops.", ch, 0, victim, TO_CHAR);
			thief_yell(ch, victim);
			check_improve(ch, gsn_strip, false, 1);
		}
	}
	else
	{
		act("Oops.", ch, 0, victim, TO_CHAR);
		thief_yell(ch, victim);
		check_improve(ch, gsn_strip, false, 1);
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}